

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O0

_Bool mi_arena_segment_os_clear_abandoned(mi_segment_t *segment,_Bool take_lock)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  _Bool _Var5;
  mi_threadid_t mVar6;
  byte in_SIL;
  long in_RDI;
  mi_segment_t *prev;
  mi_segment_t *next;
  _Bool reclaimed;
  mi_subproc_t *subproc;
  _Bool local_1;
  
  bVar4 = in_SIL & 1;
  plVar1 = *(long **)(in_RDI + 0x28);
  if ((bVar4 == 0) || (_Var5 = mi_lock_try_acquire((pthread_mutex_t *)0xc72185), _Var5)) {
    local_1 = false;
    lVar2 = *(long *)(in_RDI + 0xe8);
    lVar3 = *(long *)(in_RDI + 0xf0);
    if (((lVar2 != 0) || (lVar3 != 0)) || (plVar1[0xc] == in_RDI)) {
      if (lVar3 == 0) {
        plVar1[0xc] = lVar2;
      }
      else {
        *(long *)(lVar3 + 0xe8) = lVar2;
      }
      if (lVar2 == 0) {
        plVar1[0xd] = lVar3;
      }
      else {
        *(long *)(lVar2 + 0xf0) = lVar3;
      }
      *(undefined8 *)(in_RDI + 0xe8) = 0;
      *(undefined8 *)(in_RDI + 0xf0) = 0;
      LOCK();
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      LOCK();
      plVar1[1] = plVar1[1] + -1;
      UNLOCK();
      if (bVar4 != 0) {
        mVar6 = _mi_thread_id();
        *(mi_threadid_t *)(in_RDI + 0x118) = mVar6;
      }
      local_1 = true;
    }
    if (bVar4 != 0) {
      mi_lock_release((pthread_mutex_t *)0xc722dc);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool mi_arena_segment_os_clear_abandoned(mi_segment_t* segment, bool take_lock) {
  mi_assert(segment->memid.memkind != MI_MEM_ARENA);
  // not in an arena, remove from list of abandoned os segments
  mi_subproc_t* const subproc = segment->subproc;
  if (take_lock && !mi_lock_try_acquire(&subproc->abandoned_os_lock)) {
    return false;  // failed to acquire the lock, we just give up
  }
  // remove atomically from the abandoned os list (if possible!)
  bool reclaimed = false;
  mi_segment_t* const next = segment->abandoned_os_next;
  mi_segment_t* const prev = segment->abandoned_os_prev;
  if (next != NULL || prev != NULL || subproc->abandoned_os_list == segment) {
    #if MI_DEBUG>3
    // find ourselves in the abandoned list (and check the count)
    bool found = false;
    size_t count = 0;
    for (mi_segment_t* current = subproc->abandoned_os_list; current != NULL; current = current->abandoned_os_next) {
      if (current == segment) { found = true; }
      count++;
    }
    mi_assert_internal(found);
    mi_assert_internal(count == mi_atomic_load_relaxed(&subproc->abandoned_os_list_count));
    #endif
    // remove (atomically) from the list and reclaim
    if (prev != NULL) { prev->abandoned_os_next = next; }
    else { subproc->abandoned_os_list = next; }
    if (next != NULL) { next->abandoned_os_prev = prev; }
    else { subproc->abandoned_os_list_tail = prev; }
    segment->abandoned_os_next = NULL;
    segment->abandoned_os_prev = NULL;
    mi_atomic_decrement_relaxed(&subproc->abandoned_count);
    mi_atomic_decrement_relaxed(&subproc->abandoned_os_list_count);
    if (take_lock) { // don't reset the thread_id when iterating
      mi_atomic_store_release(&segment->thread_id, _mi_thread_id());
    }
    reclaimed = true;
  }
  if (take_lock) { mi_lock_release(&segment->subproc->abandoned_os_lock); }
  return reclaimed;
}